

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammarResolver.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::GrammarResolver::containsNameSpace(GrammarResolver *this,XMLCh *nameSpaceKey)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar3;
  
  if (nameSpaceKey != (XMLCh *)0x0) {
    bVar1 = RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::containsKey
                      (this->fGrammarBucket,nameSpaceKey);
    if (bVar1) {
      return true;
    }
    if (this->fUseCachedGrammar == true) {
      bVar1 = RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::containsKey
                        (this->fGrammarFromPool,nameSpaceKey);
      if (bVar1) {
        return true;
      }
      iVar2 = (*this->fGrammarPool->_vptr_XMLGrammarPool[0xc])(this->fGrammarPool,nameSpaceKey);
      plVar3 = (long *)CONCAT44(extraout_var,iVar2);
      iVar2 = (*this->fGrammarPool->_vptr_XMLGrammarPool[3])(this->fGrammarPool,plVar3);
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 8))(plVar3);
      }
      if (CONCAT44(extraout_var_00,iVar2) != 0) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool GrammarResolver::containsNameSpace( const XMLCh* const nameSpaceKey )
{
    if (!nameSpaceKey)
        return false;
    if (fGrammarBucket->containsKey(nameSpaceKey))
        return true;
    if (fUseCachedGrammar)
    {
        if (fGrammarFromPool->containsKey(nameSpaceKey))
            return true;

        // Lastly, need to check in fGrammarPool        
        XMLSchemaDescription* gramDesc = fGrammarPool->createSchemaDescription(nameSpaceKey);
        Janitor<XMLGrammarDescription> janName(gramDesc);
        Grammar* grammar = fGrammarPool->retrieveGrammar(gramDesc);
        if (grammar)
            return true;
    }

    return false;
}